

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O1

int64_t __thiscall SharedMemRingBuffer::GetMinIndexOfConsumers(SharedMemRingBuffer *this)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  bool bVar5;
  
  if ((this->ring_buffer_status_on_shared_mem_->registered_consumer_count).super___atomic_base<int>.
      _M_i < 1) {
    return 0;
  }
  lVar4 = 0x7fffffffffffffff;
  lVar2 = 0;
  bVar5 = false;
  do {
    lVar1 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[lVar2].
            super___atomic_base<long>._M_i;
    if (lVar1 < lVar4) {
      bVar5 = true;
      lVar4 = lVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
                   super___atomic_base<int>._M_i);
  iVar3 = 0;
  if (bVar5) {
    iVar3 = lVar4;
  }
  return iVar3;
}

Assistant:

int64_t SharedMemRingBuffer::GetMinIndexOfConsumers()
{
    int64_t min_index = INT64_MAX ;
    bool is_found = false;
    for(int i = 0; i < ring_buffer_status_on_shared_mem_->registered_consumer_count; i++) {
        int64_t nIndex = ring_buffer_status_on_shared_mem_->array_consumer_indexes[i];
        if( nIndex < min_index ) {
            min_index = nIndex;
            is_found = true;
        }
    }
    if(!is_found) {
        return 0;
    }
    return min_index ;
}